

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

void delete_node(ps_lattice_t *dag,ps_latnode_t *node)

{
  latlink_list_s *plVar1;
  latlink_list_t *next_x;
  latlink_list_t *x;
  ps_latnode_t *node_local;
  ps_lattice_t *dag_local;
  
  next_x = node->exits;
  while (next_x != (latlink_list_t *)0x0) {
    plVar1 = next_x->next;
    next_x->link->from = (ps_latnode_s *)0x0;
    __listelem_free__(dag->latlink_list_alloc,next_x,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                      ,0x7d);
    next_x = plVar1;
  }
  next_x = node->entries;
  while (next_x != (latlink_list_t *)0x0) {
    plVar1 = next_x->next;
    next_x->link->to = (ps_latnode_s *)0x0;
    __listelem_free__(dag->latlink_list_alloc,next_x,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                      ,0x82);
    next_x = plVar1;
  }
  __listelem_free__(dag->latnode_alloc,node,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                    ,0x84);
  return;
}

Assistant:

static void
delete_node(ps_lattice_t *dag, ps_latnode_t *node)
{
    latlink_list_t *x, *next_x;

    for (x = node->exits; x; x = next_x) {
        next_x = x->next;
        x->link->from = NULL;
        listelem_free(dag->latlink_list_alloc, x);
    }
    for (x = node->entries; x; x = next_x) {
        next_x = x->next;
        x->link->to = NULL;
        listelem_free(dag->latlink_list_alloc, x);
    }
    listelem_free(dag->latnode_alloc, node);
}